

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_short_&,_const_int_&> * __thiscall
Catch::ExprLhs<short_const&>::operator==(ExprLhs<const_short_&> *this,int *rhs)

{
  StringRef op;
  bool comparisonResult;
  int *in_RDX;
  short *in_RSI;
  BinaryExpr<const_short_&,_const_int_&> *in_RDI;
  int *in_stack_ffffffffffffffa8;
  char *pcVar1;
  BinaryExpr<const_short_&,_const_int_&> *pBVar2;
  StringRef local_28 [2];
  
  pBVar2 = in_RDI;
  comparisonResult = compareEqual<short,int>(*(short **)in_RSI,in_RDX);
  pcVar1 = *(char **)in_RSI;
  Catch::StringRef::StringRef(local_28,"==");
  op.m_size = (size_type)pBVar2;
  op.m_start = pcVar1;
  BinaryExpr<const_short_&,_const_int_&>::BinaryExpr
            (in_RDI,comparisonResult,in_RSI,op,in_stack_ffffffffffffffa8);
  return pBVar2;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }